

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

BOOL __thiscall Js::JavascriptProxy::IsWritable(JavascriptProxy *this,PropertyId propertyId)

{
  undefined4 propertyId_00;
  bool bVar1;
  BOOL BVar2;
  ScriptContext *requestContext;
  uint local_64;
  undefined1 local_50 [8];
  PropertyDescriptor propertyDescriptor;
  PropertyId propertyId_local;
  JavascriptProxy *this_local;
  
  propertyDescriptor._44_4_ = propertyId;
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_50);
  propertyId_00 = propertyDescriptor._44_4_;
  requestContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  BVar2 = GetOwnPropertyDescriptor
                    ((RecyclableObject *)this,propertyId_00,requestContext,
                     (PropertyDescriptor *)local_50);
  if (BVar2 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    bVar1 = PropertyDescriptor::WritableSpecified((PropertyDescriptor *)local_50);
    if (bVar1) {
      bVar1 = PropertyDescriptor::IsWritable((PropertyDescriptor *)local_50);
      local_64 = (uint)bVar1;
    }
    else {
      local_64 = 0;
    }
    this_local._4_4_ = local_64;
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptProxy::IsWritable(PropertyId propertyId)
    {
        PropertyDescriptor propertyDescriptor;
        if (!GetOwnPropertyDescriptor(this, propertyId, GetScriptContext(), &propertyDescriptor))
        {
            return FALSE;
        }

        // If property descriptor has getter/setter we should check if writable is specified before checking IsWritable
        return propertyDescriptor.WritableSpecified() ? propertyDescriptor.IsWritable() : FALSE;
    }